

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_fprintdot_nc_rec(FILE *out,MTBDD mtbdd)

{
  int iVar1;
  uint32_t uVar2;
  mtbddnode_t n_00;
  uint64_t uVar3;
  MTBDD MVar4;
  mtbddnode_t n;
  MTBDD mtbdd_local;
  FILE *out_local;
  
  n_00 = MTBDD_GETNODE(mtbdd);
  iVar1 = mtbddnode_getmark(n_00);
  if (iVar1 == 0) {
    mtbddnode_setmark(n_00,1);
    if (mtbdd == 0x8000000000000000) {
      fprintf((FILE *)out,"%lu [shape=box, style=filled, label=\"T\"];\n",0x8000000000000000);
    }
    else if (mtbdd == 0) {
      fprintf((FILE *)out,"0 [shape=box, style=filled, label=\"F\"];\n");
    }
    else {
      iVar1 = mtbddnode_isleaf(n_00);
      if (iVar1 == 0) {
        uVar2 = mtbddnode_getvariable(n_00);
        fprintf((FILE *)out,"%lu [label=\"%u\"];\n",mtbdd,(ulong)uVar2);
        uVar3 = mtbddnode_getlow(n_00);
        mtbdd_fprintdot_nc_rec(out,uVar3);
        uVar3 = mtbddnode_gethigh(n_00);
        mtbdd_fprintdot_nc_rec(out,uVar3);
        MVar4 = mtbddnode_followlow(mtbdd,n_00);
        fprintf((FILE *)out,"%lu -> %lu [style=dashed];\n",mtbdd,MVar4);
        MVar4 = mtbddnode_followhigh(mtbdd,n_00);
        fprintf((FILE *)out,"%lu -> %lu [style=solid];\n",mtbdd,MVar4);
      }
      else {
        fprintf((FILE *)out,"%lu [shape=box, style=filled, label=\"",mtbdd);
        mtbdd_fprint_leaf(out,mtbdd);
        fprintf((FILE *)out,"\"];\n");
      }
    }
  }
  return;
}

Assistant:

static void
mtbdd_fprintdot_nc_rec(FILE *out, MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd); // also works for mtbdd_false
    if (mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 1);

    if (mtbdd == mtbdd_true) {
        fprintf(out, "%" PRIu64 " [shape=box, style=filled, label=\"T\"];\n", mtbdd);
    } else if (mtbdd == mtbdd_false) {
        fprintf(out, "0 [shape=box, style=filled, label=\"F\"];\n");
    } else if (mtbddnode_isleaf(n)) {
        fprintf(out, "%" PRIu64 " [shape=box, style=filled, label=\"", mtbdd);
        mtbdd_fprint_leaf(out, mtbdd);
        fprintf(out, "\"];\n");
    } else {
        fprintf(out, "%" PRIu64 " [label=\"%" PRIu32 "\"];\n", mtbdd, mtbddnode_getvariable(n));

        mtbdd_fprintdot_nc_rec(out, mtbddnode_getlow(n));
        mtbdd_fprintdot_nc_rec(out, mtbddnode_gethigh(n));

        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=dashed];\n", mtbdd, node_getlow(mtbdd, n));
        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=solid];\n", mtbdd, node_gethigh(mtbdd, n));
    }
}